

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall
cmCTest::PopulateCustomVector
          (cmCTest *this,cmMakefile *mf,string *def,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec)

{
  char *pcVar1;
  ostream *poVar2;
  pointer pbVar3;
  ostringstream cmCTestLog_msg;
  char *local_1c8 [4];
  string local_1a8 [11];
  
  pcVar1 = cmMakefile::GetDefinition(mf,def);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"PopulateCustomVector: ");
    poVar2 = std::operator<<(poVar2,(string *)def);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x92e,local_1c8[0],false);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(vec);
    std::__cxx11::string::string((string *)local_1a8,pcVar1,(allocator *)local_1c8);
    cmSystemTools::ExpandListArgument(local_1a8,vec,false);
    std::__cxx11::string::~string((string *)local_1a8);
    for (pbVar3 = (vec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != (vec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = std::operator<<((ostream *)local_1a8,"  -- ");
      poVar2 = std::operator<<(poVar2,(string *)pbVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::stringbuf::str();
      Log(this,0,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x935,local_1c8[0],false);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
  }
  return;
}

Assistant:

void cmCTest::PopulateCustomVector(cmMakefile* mf, const std::string& def,
                                   std::vector<std::string>& vec)
{
  const char* dval = mf->GetDefinition(def);
  if (!dval) {
    return;
  }
  cmCTestLog(this, DEBUG, "PopulateCustomVector: " << def << std::endl);

  vec.clear();
  cmSystemTools::ExpandListArgument(dval, vec);

  for (std::vector<std::string>::const_iterator it = vec.begin();
       it != vec.end(); ++it) {
    cmCTestLog(this, DEBUG, "  -- " << *it << std::endl);
  }
}